

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2cap.cc
# Opt level: O0

void __thiscall S2Cap::AddPoint(S2Cap *this,S2Point *p)

{
  bool bVar1;
  ostream *poVar2;
  S1ChordAngle *pSVar3;
  S1ChordAngle SVar4;
  S1ChordAngle local_58 [4];
  byte local_31;
  S2LogMessage local_30;
  S2LogMessageVoidify local_19;
  S2Point *local_18;
  S2Point *p_local;
  S2Cap *this_local;
  
  local_18 = p;
  p_local = (S2Point *)this;
  bVar1 = S2::IsUnitLength(p);
  local_31 = 0;
  if (((bVar1 ^ 0xffU) & 1) != 0) {
    S2FatalLogMessage::S2FatalLogMessage
              ((S2FatalLogMessage *)&local_30,
               "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/s2cap.cc"
               ,0x55,kFatal,(ostream *)&std::cerr);
    local_31 = 1;
    poVar2 = S2LogMessage::stream(&local_30);
    poVar2 = std::operator<<(poVar2,"Check failed: S2::IsUnitLength(p) ");
    S2LogMessageVoidify::operator&(&local_19,poVar2);
  }
  if ((local_31 & 1) != 0) {
    S2FatalLogMessage::~S2FatalLogMessage((S2FatalLogMessage *)&local_30);
  }
  bVar1 = is_empty(this);
  if (bVar1) {
    (this->center_).c_[0] = local_18->c_[0];
    (this->center_).c_[1] = local_18->c_[1];
    (this->center_).c_[2] = local_18->c_[2];
    SVar4 = S1ChordAngle::Zero();
    (this->radius_).length2_ = SVar4.length2_;
  }
  else {
    S1ChordAngle::S1ChordAngle(local_58,&this->center_,local_18);
    pSVar3 = std::max<S1ChordAngle>(&this->radius_,local_58);
    (this->radius_).length2_ = pSVar3->length2_;
  }
  return;
}

Assistant:

void S2Cap::AddPoint(const S2Point& p) {
  // Compute the squared chord length, then convert it into a height.
  S2_DCHECK(S2::IsUnitLength(p));
  if (is_empty()) {
    center_ = p;
    radius_ = S1ChordAngle::Zero();
  } else {
    // After calling cap.AddPoint(p), cap.Contains(p) must be true.  However
    // we don't need to do anything special to achieve this because Contains()
    // does exactly the same distance calculation that we do here.
    radius_ = max(radius_, S1ChordAngle(center_, p));
  }
}